

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void WindowSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  ImChunkStream<ImGuiWindowSettings> *this;
  short sVar1;
  ImGuiWindow *pIVar2;
  char *pcVar3;
  short sVar4;
  int iVar5;
  ImGuiID IVar6;
  ImGuiWindow **ppIVar7;
  ImGuiWindowSettings *pIVar8;
  int iVar9;
  
  this = &ctx->SettingsWindows;
  for (iVar9 = 0; iVar9 != (ctx->Windows).Size; iVar9 = iVar9 + 1) {
    ppIVar7 = ImVector<ImGuiWindow_*>::operator[](&ctx->Windows,iVar9);
    pIVar2 = *ppIVar7;
    if ((pIVar2->Flags & 0x100) == 0) {
      if (pIVar2->SettingsOffset == -1) {
        pIVar8 = ImGui::FindWindowSettings(pIVar2->ID);
      }
      else {
        pIVar8 = ImChunkStream<ImGuiWindowSettings>::ptr_from_offset(this,pIVar2->SettingsOffset);
      }
      if (pIVar8 == (ImGuiWindowSettings *)0x0) {
        pIVar8 = ImGui::CreateNewWindowSettings(pIVar2->Name);
        iVar5 = ImChunkStream<ImGuiWindowSettings>::offset_from_ptr(this,pIVar8);
        pIVar2->SettingsOffset = iVar5;
      }
      if (pIVar8->ID != pIVar2->ID) {
        __assert_fail("settings->ID == window->ID",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x2a8b,
                      "void WindowSettingsHandler_WriteAll(ImGuiContext *, ImGuiSettingsHandler *, ImGuiTextBuffer *)"
                     );
      }
      pIVar8->Pos = (ImVec2ih)
                    ((int)((pIVar2->Pos).x - (pIVar2->ViewportPos).x) & 0xffffU |
                    (int)((pIVar2->Pos).y - (pIVar2->ViewportPos).y) << 0x10);
      pIVar8->Size = (ImVec2ih)
                     ((int)(pIVar2->SizeFull).x & 0xffffU | (int)(pIVar2->SizeFull).y << 0x10);
      pIVar8->ViewportId = pIVar2->ViewportId;
      pIVar8->ViewportPos =
           (ImVec2ih)((int)(pIVar2->ViewportPos).x & 0xffffU | (int)(pIVar2->ViewportPos).y << 0x10)
      ;
      if (pIVar2->DockNode == (ImGuiDockNode *)0x0) {
        IVar6 = pIVar2->DockId;
      }
      else {
        IVar6 = pIVar2->DockNode->ID;
        if (IVar6 != pIVar2->DockId) {
          __assert_fail("window->DockNode == __null || window->DockNode->ID == window->DockId",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                        ,0x2a90,
                        "void WindowSettingsHandler_WriteAll(ImGuiContext *, ImGuiSettingsHandler *, ImGuiTextBuffer *)"
                       );
        }
      }
      pIVar8->DockId = IVar6;
      pIVar8->ClassId = (pIVar2->WindowClass).ClassId;
      pIVar8->DockOrder = pIVar2->DockOrder;
      pIVar8->Collapsed = pIVar2->Collapsed;
    }
  }
  iVar9 = (buf->Buf).Size;
  iVar5 = iVar9 + -1;
  if (iVar9 == 0) {
    iVar5 = 0;
  }
  ImVector<char>::reserve(&buf->Buf,(ctx->SettingsWindows).Buf.Size * 6 + iVar5);
  pcVar3 = (ctx->SettingsWindows).Buf.Data;
  pIVar8 = (ImGuiWindowSettings *)(pcVar3 + 4);
  if (pcVar3 == (char *)0x0) {
    pIVar8 = (ImGuiWindowSettings *)0x0;
  }
  do {
    if (pIVar8 == (ImGuiWindowSettings *)0x0) {
      return;
    }
    ImGuiTextBuffer::appendf(buf,"[%s][%s]\n",handler->TypeName,pIVar8 + 1);
    if ((pIVar8->ViewportId != 0) && (pIVar8->ViewportId != 0x11111111)) {
      ImGuiTextBuffer::appendf
                (buf,"ViewportPos=%d,%d\n",(ulong)(uint)(int)(pIVar8->ViewportPos).x,
                 (ulong)(uint)(int)(pIVar8->ViewportPos).y);
      ImGuiTextBuffer::appendf(buf,"ViewportId=0x%08X\n",(ulong)pIVar8->ViewportId);
    }
    sVar1 = (pIVar8->Pos).x;
    sVar4 = (pIVar8->Pos).y;
    if (sVar4 == 0 && sVar1 == 0) {
      if (pIVar8->ViewportId == 0x11111111) {
        sVar4 = 0;
        goto LAB_00128570;
      }
    }
    else {
LAB_00128570:
      ImGuiTextBuffer::appendf(buf,"Pos=%d,%d\n",(ulong)(uint)(int)sVar1,(ulong)(uint)(int)sVar4);
    }
    sVar1 = (pIVar8->Size).x;
    sVar4 = (pIVar8->Size).y;
    if (sVar1 != 0 || sVar4 != 0) {
      ImGuiTextBuffer::appendf(buf,"Size=%d,%d\n",(ulong)(uint)(int)sVar1,(ulong)(uint)(int)sVar4);
    }
    ImGuiTextBuffer::appendf(buf,"Collapsed=%d\n",(ulong)pIVar8->Collapsed);
    if (pIVar8->DockId != 0) {
      if (pIVar8->DockOrder == -1) {
        ImGuiTextBuffer::appendf(buf,"DockId=0x%08X\n");
      }
      else {
        ImGuiTextBuffer::appendf(buf,"DockId=0x%08X,%d\n");
      }
      if (pIVar8->ClassId != 0) {
        ImGuiTextBuffer::appendf(buf,"ClassId=0x%08X\n");
      }
    }
    ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
    pIVar8 = ImChunkStream<ImGuiWindowSettings>::next_chunk(this,pIVar8);
  } while( true );
}

Assistant:

static void WindowSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    // (if a window wasn't opened in this session we preserve its settings)
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;

        ImGuiWindowSettings* settings = (window->SettingsOffset != -1) ? g.SettingsWindows.ptr_from_offset(window->SettingsOffset) : ImGui::FindWindowSettings(window->ID);
        if (!settings)
        {
            settings = ImGui::CreateNewWindowSettings(window->Name);
            window->SettingsOffset = g.SettingsWindows.offset_from_ptr(settings);
        }
        IM_ASSERT(settings->ID == window->ID);
        settings->Pos = ImVec2ih(window->Pos - window->ViewportPos);
        settings->Size = ImVec2ih(window->SizeFull);
        settings->ViewportId = window->ViewportId;
        settings->ViewportPos = ImVec2ih(window->ViewportPos);
        IM_ASSERT(window->DockNode == NULL || window->DockNode->ID == window->DockId);
        settings->DockId = window->DockId;
        settings->ClassId = window->WindowClass.ClassId;
        settings->DockOrder = window->DockOrder;
        settings->Collapsed = window->Collapsed;
    }

    // Write to text buffer
    buf->reserve(buf->size() + g.SettingsWindows.size() * 6); // ballpark reserve
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
    {
        const char* settings_name = settings->GetName();
        buf->appendf("[%s][%s]\n", handler->TypeName, settings_name);
        if (settings->ViewportId != 0 && settings->ViewportId != ImGui::IMGUI_VIEWPORT_DEFAULT_ID)
        {
            buf->appendf("ViewportPos=%d,%d\n", settings->ViewportPos.x, settings->ViewportPos.y);
            buf->appendf("ViewportId=0x%08X\n", settings->ViewportId);
        }
        if (settings->Pos.x != 0 || settings->Pos.y != 0 || settings->ViewportId == ImGui::IMGUI_VIEWPORT_DEFAULT_ID)
            buf->appendf("Pos=%d,%d\n", settings->Pos.x, settings->Pos.y);
        if (settings->Size.x != 0 || settings->Size.y != 0)
            buf->appendf("Size=%d,%d\n", settings->Size.x, settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        if (settings->DockId != 0)
        {
            // Write DockId as 4 digits if possible. Automatic DockId are small numbers, but full explicit DockSpace() are full ImGuiID range.
            if (settings->DockOrder == -1)
                buf->appendf("DockId=0x%08X\n", settings->DockId);
            else
                buf->appendf("DockId=0x%08X,%d\n", settings->DockId, settings->DockOrder);
            if (settings->ClassId != 0)
                buf->appendf("ClassId=0x%08X\n", settings->ClassId);
        }
        buf->append("\n");
    }
}